

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_enc.c
# Opt level: O3

int VP8LEncodeImage(WebPConfig *config,WebPPicture *picture)

{
  int iVar1;
  int iVar2;
  WebPAuxStats *pWVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  WebPEncodingError error;
  WebPAuxStats *stats;
  int percent;
  VP8LBitWriter bw;
  size_t coded_size;
  int local_74;
  int local_70;
  int local_6c;
  VP8LBitWriter local_68;
  int local_38 [2];
  
  local_74 = 0;
  if (picture == (WebPPicture *)0x0) {
    return 0;
  }
  if ((config == (WebPConfig *)0x0) || (picture->argb == (uint32_t *)0x0)) {
    error = VP8_ENC_ERROR_NULL_PARAMETER;
    goto LAB_0013d61b;
  }
  iVar1 = picture->width;
  iVar2 = picture->height;
  iVar5 = VP8LBitWriterInit(&local_68,
                            (long)(iVar2 * iVar1 << (config->image_hint != WEBP_HINT_GRAPH)));
  error = VP8_ENC_ERROR_OUT_OF_MEMORY;
  if (iVar5 != 0) {
    iVar5 = WebPReportProgress(picture,1,&local_74);
    if (iVar5 == 0) goto LAB_0013d5f8;
    pWVar3 = picture->stats;
    local_70 = iVar1;
    local_6c = iVar2;
    if (pWVar3 != (WebPAuxStats *)0x0) {
      memset(pWVar3,0,0xbc);
      pWVar3->PSNR[0] = 99.0;
      pWVar3->PSNR[1] = 99.0;
      pWVar3->PSNR[2] = 99.0;
      pWVar3->PSNR[3] = 99.0;
      pWVar3->PSNR[4] = 99.0;
    }
    iVar1 = picture->width;
    iVar2 = picture->height;
    if (0x1f < local_68.used_) {
      VP8LPutBitsFlushBits(&local_68);
    }
    local_68.bits_ = (ulong)(iVar1 - 1) << ((byte)local_68.used_ & 0x3f) | local_68.bits_;
    iVar1 = local_68.used_ + 0xe;
    bVar4 = 0x11 < local_68.used_;
    local_68.used_ = iVar1;
    if (bVar4) {
      VP8LPutBitsFlushBits(&local_68);
    }
    iVar1 = local_6c;
    local_68.bits_ = (ulong)(iVar2 - 1) << ((byte)local_68.used_ & 0x3f) | local_68.bits_;
    local_68.used_ = local_68.used_ + 0xe;
    error = VP8_ENC_ERROR_OUT_OF_MEMORY;
    if (local_68.error_ == 0) {
      uVar6 = WebPPictureHasTransparency(picture);
      if (0x1f < local_68.used_) {
        VP8LPutBitsFlushBits(&local_68);
      }
      local_68.bits_ = local_68.bits_ | (ulong)uVar6 << ((byte)local_68.used_ & 0x3f);
      iVar2 = local_68.used_ + 1;
      bVar4 = 0x1e < local_68.used_;
      local_68.used_ = iVar2;
      if (bVar4) {
        VP8LPutBitsFlushBits(&local_68);
      }
      iVar2 = local_70;
      local_68.used_ = local_68.used_ + 3;
      if (local_68.error_ == 0) {
        iVar5 = WebPReportProgress(picture,5,&local_74);
        if (iVar5 == 0) {
LAB_0013d5f8:
          error = VP8_ENC_ERROR_USER_ABORT;
        }
        else {
          error = VP8LEncodeStream(config,picture,&local_68,1);
          if (error == VP8_ENC_OK) {
            iVar5 = WebPReportProgress(picture,0x5a,&local_74);
            if (iVar5 == 0) goto LAB_0013d5f8;
            error = WriteImage(picture,&local_68,(size_t *)local_38);
            if (error == VP8_ENC_OK) {
              iVar5 = WebPReportProgress(picture,100,&local_74);
              error = VP8_ENC_ERROR_USER_ABORT;
              if (iVar5 != 0) {
                pWVar3 = picture->stats;
                if (pWVar3 != (WebPAuxStats *)0x0) {
                  pWVar3->coded_size = pWVar3->coded_size + local_38[0];
                  pWVar3->lossless_size = local_38[0];
                }
                if (picture->extra_info == (uint8_t *)0x0) {
                  error = VP8_ENC_OK;
                }
                else {
                  error = VP8_ENC_OK;
                  memset(picture->extra_info,0,(long)((iVar1 + 0xf >> 4) * (iVar2 + 0xf >> 4)));
                }
              }
            }
          }
        }
      }
    }
  }
  if (local_68.error_ != 0) {
    error = VP8_ENC_ERROR_OUT_OF_MEMORY;
  }
  VP8LBitWriterWipeOut(&local_68);
  if (error == VP8_ENC_OK) {
    return 1;
  }
LAB_0013d61b:
  WebPEncodingSetError(picture,error);
  return 0;
}

Assistant:

int VP8LEncodeImage(const WebPConfig* const config,
                    const WebPPicture* const picture) {
  int width, height;
  int has_alpha;
  size_t coded_size;
  int percent = 0;
  int initial_size;
  WebPEncodingError err = VP8_ENC_OK;
  VP8LBitWriter bw;

  if (picture == NULL) return 0;

  if (config == NULL || picture->argb == NULL) {
    err = VP8_ENC_ERROR_NULL_PARAMETER;
    WebPEncodingSetError(picture, err);
    return 0;
  }

  width = picture->width;
  height = picture->height;
  // Initialize BitWriter with size corresponding to 16 bpp to photo images and
  // 8 bpp for graphical images.
  initial_size = (config->image_hint == WEBP_HINT_GRAPH) ?
      width * height : width * height * 2;
  if (!VP8LBitWriterInit(&bw, initial_size)) {
    err = VP8_ENC_ERROR_OUT_OF_MEMORY;
    goto Error;
  }

  if (!WebPReportProgress(picture, 1, &percent)) {
 UserAbort:
    err = VP8_ENC_ERROR_USER_ABORT;
    goto Error;
  }
  // Reset stats (for pure lossless coding)
  if (picture->stats != NULL) {
    WebPAuxStats* const stats = picture->stats;
    memset(stats, 0, sizeof(*stats));
    stats->PSNR[0] = 99.f;
    stats->PSNR[1] = 99.f;
    stats->PSNR[2] = 99.f;
    stats->PSNR[3] = 99.f;
    stats->PSNR[4] = 99.f;
  }

  // Write image size.
  if (!WriteImageSize(picture, &bw)) {
    err = VP8_ENC_ERROR_OUT_OF_MEMORY;
    goto Error;
  }

  has_alpha = WebPPictureHasTransparency(picture);
  // Write the non-trivial Alpha flag and lossless version.
  if (!WriteRealAlphaAndVersion(&bw, has_alpha)) {
    err = VP8_ENC_ERROR_OUT_OF_MEMORY;
    goto Error;
  }

  if (!WebPReportProgress(picture, 5, &percent)) goto UserAbort;

  // Encode main image stream.
  err = VP8LEncodeStream(config, picture, &bw, 1 /*use_cache*/);
  if (err != VP8_ENC_OK) goto Error;

  if (!WebPReportProgress(picture, 90, &percent)) goto UserAbort;

  // Finish the RIFF chunk.
  err = WriteImage(picture, &bw, &coded_size);
  if (err != VP8_ENC_OK) goto Error;

  if (!WebPReportProgress(picture, 100, &percent)) goto UserAbort;

#if !defined(WEBP_DISABLE_STATS)
  // Save size.
  if (picture->stats != NULL) {
    picture->stats->coded_size += (int)coded_size;
    picture->stats->lossless_size = (int)coded_size;
  }
#endif

  if (picture->extra_info != NULL) {
    const int mb_w = (width + 15) >> 4;
    const int mb_h = (height + 15) >> 4;
    memset(picture->extra_info, 0, mb_w * mb_h * sizeof(*picture->extra_info));
  }

 Error:
  if (bw.error_) err = VP8_ENC_ERROR_OUT_OF_MEMORY;
  VP8LBitWriterWipeOut(&bw);
  if (err != VP8_ENC_OK) {
    WebPEncodingSetError(picture, err);
    return 0;
  }
  return 1;
}